

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 uVar2;
  uint uVar3;
  Base *pBVar4;
  Base *dest;
  Base *dest_00;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  DNASlice slc2;
  DNASlice slc;
  DNASlice foo;
  DNASlice local_68;
  DNASlice local_58;
  DNASlice local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (argc == 2) {
    __s1 = argv[1];
    iVar1 = strcmp(__s1,"test");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"show");
      if (iVar1 == 0) {
        DNASlice::DNASlice(&local_58,"aggctca");
        printf("Created DNA slice: ");
        DNA::print(local_58._dna,local_58._size);
        putc(10,_stdout);
        printf("Created a DNA view: ");
        DNA::print(local_58._dna,local_58._size - 2);
        putc(10,_stdout);
        if (local_58._dna != (Base *)0x0) {
          operator_delete__(local_58._dna);
        }
      }
      return 0;
    }
  }
  else {
    main_cold_1();
  }
  pBVar4 = (Base *)operator_new__(0x28);
  DNA::fromCStr(pBVar4,10,"AATG");
  lVar10 = 0;
  printf("Got the DNA ");
  DNA::print(pBVar4,10);
  puts(" .");
  local_38 = *(undefined8 *)pBVar4;
  uStack_30 = *(undefined8 *)(pBVar4 + 2);
  operator_delete__(pBVar4);
  dest = (Base *)operator_new__(0x28);
  dest_00 = (Base *)operator_new__(0x10);
  DNA::fromCStr(dest,10,"AATTGGCCAA");
  DNA::fromCStr(dest_00,4,"CCAA");
  uVar6 = 0;
  pBVar4 = dest_00;
  do {
    if (uVar6 == 0) {
      uVar6 = (ulong)(*pBVar4 == *(Base *)((long)dest + lVar10));
      pBVar4 = pBVar4 + uVar6;
    }
    else {
      if (pBVar4 == dest_00 + 4) {
        uVar8 = 0;
        goto LAB_00101588;
      }
      bVar11 = *pBVar4 == *(Base *)((long)dest + lVar10);
      uVar6 = (ulong)bVar11;
      pBVar4 = pBVar4 + 1;
      if (!bVar11) {
        pBVar4 = dest_00;
      }
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x28);
  uVar8 = (uint)(pBVar4 != dest_00 + 4);
LAB_00101588:
  operator_delete__(dest);
  operator_delete__(dest_00);
  DNASlice::DNASlice(&local_58,"AGCCT");
  DNASlice::DNASlice(&local_68,"ACGTT");
  DNASlice::DNASlice(&local_48,"ACGTT");
  iVar1 = 1;
  if (local_48._size == local_68._size) {
    if (local_48._size != 0) {
      lVar10 = 0;
      do {
        if (*(int *)((long)local_48._dna + lVar10) != *(int *)((long)local_68._dna + lVar10))
        goto LAB_00101608;
        lVar10 = lVar10 + 4;
      } while (local_48._size << 2 != lVar10);
    }
    iVar1 = 0;
  }
LAB_00101608:
  iVar7 = 0;
  if ((local_58._size == local_68._size) && (iVar7 = 1, local_68._size != 0)) {
    local_68._size = local_68._size << 2;
    sVar9 = 0;
    do {
      if (*(int *)((long)local_58._dna + sVar9) != *(int *)((long)local_68._dna + sVar9)) {
        iVar7 = 0;
        break;
      }
      sVar9 = sVar9 + 4;
    } while (local_68._size != sVar9);
  }
  uVar2 = (undefined4)local_68._size;
  if (local_48._dna != (Base *)0x0) {
    operator_delete__(local_48._dna);
    uVar2 = extraout_EAX;
  }
  if (local_68._dna != (Base *)0x0) {
    operator_delete__(local_68._dna);
    uVar2 = extraout_EAX_00;
  }
  if (local_58._dna != (Base *)0x0) {
    operator_delete__(local_58._dna);
    uVar2 = extraout_EAX_01;
  }
  auVar12._0_4_ = -(uint)((int)local_38 == 0);
  auVar12._4_4_ = -(uint)(local_38._4_4_ == 0);
  auVar12._8_4_ = -(uint)((int)uStack_30 == 3);
  auVar12._12_4_ = -(uint)(uStack_30._4_4_ == 2);
  uVar3 = movmskps(uVar2,auVar12);
  bVar5 = (byte)(uVar3 ^ 0xf);
  uVar8 = iVar7 + uVar8 + iVar1 +
                  (uint)(bVar5 >> 3) + (uint)((bVar5 & 4) >> 2) +
                  (uint)((bVar5 & 2) >> 1) + ((uVar3 ^ 0xf) & 1);
  printf("Got %u failures\n",(ulong)uVar8);
  exit((uint)(uVar8 != 0) * 3);
}

Assistant:

int main(int argc, char const* argv[]) {
	if (argc != 2) {
		std::fprintf(stderr, "Must specify mode, got %d args\n", argc);
		std::exit(2);
	}
	
	if (std::strcmp(argv[1], "test") == 0) {
		gTester.clear();
		testfromCStr();
		testContains();
		testDNASlice();
		gTester.finish();
	}
	
	if (std::strcmp(argv[1], "show") == 0) {
		DNASlice s1("aggctca");
		std::printf("Created DNA slice: ");
		s1.print();
		std::putc('\n', stdout);
		DNAView v1(s1.dna(), s1.size() - 2);
		std::printf("Created a DNA view: ");
		DNA::print(v1.dna(), v1.size());
		std::putc('\n', stdout);
		
	}
	return 0;
}